

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall nodesTest_methodTesting_Test::TestBody(nodesTest_methodTesting_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_120;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_4;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_cc;
  double local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  int i;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  nodes node2;
  AssertHelper local_60;
  Message local_58 [3];
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  nodes node1;
  nodesTest_methodTesting_Test *this_local;
  
  nodes::nodes((nodes *)&gtest_ar.message_);
  local_3c = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_38,"node1.x_","0",(int *)&gtest_ar.message_,&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  node2.f_cost_._5_3_ = 0;
  node2.f_cost_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (node2.f_cost_._4_4_ == 0) {
    nodes::nodes((nodes *)&gtest_ar_1.message_,1,1,0.0,0.0);
    local_94 = 0;
    testing::internal::EqHelper<false>::Compare<double,int>
              ((EqHelper<false> *)local_90,"node2.f_cost_","0",&node2.g_cost_,&local_94);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x36,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,&local_a0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
      testing::Message::~Message(&local_a0);
    }
    node2.f_cost_._5_3_ = 0;
    node2.f_cost_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (node2.f_cost_._4_4_ == 0) {
      gtest_ar_2.message_.ptr_._4_4_ = 0;
      local_c8 = nodes::compute_g((nodes *)&gtest_ar_1.message_,0);
      local_cc = 1;
      testing::internal::EqHelper<false>::Compare<double,int>
                ((EqHelper<false> *)local_c0,"node2.compute_g(i)","1",&local_c8,&local_cc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                   ,0x39,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d8);
      }
      node2.f_cost_._5_3_ = 0;
      node2.f_cost_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
      if (node2.f_cost_._4_4_ == 0) {
        dVar3 = nodes::compute_h((nodes *)&gtest_ar_1.message_,1,1);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_f0,"node2.compute_h(1, 1)","0.0",dVar3,0.0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar1) {
          testing::Message::Message(&local_f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                     ,0x3b,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_f8);
        }
        node2.f_cost_._5_3_ = 0;
        node2.f_cost_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if (node2.f_cost_._4_4_ == 0) {
          dVar3 = nodes::compute_f((nodes *)&gtest_ar_1.message_,1,1);
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)local_110,"node2.compute_f(1, 1)","1.0",dVar3,1.0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
          if (!bVar1) {
            testing::Message::Message(&local_118);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
            testing::internal::AssertHelper::AssertHelper
                      (&local_120,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                       ,0x3d,pcVar2);
            testing::internal::AssertHelper::operator=(&local_120,&local_118);
            testing::internal::AssertHelper::~AssertHelper(&local_120);
            testing::Message::~Message(&local_118);
          }
          node2.f_cost_._5_3_ = 0;
          node2.f_cost_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
          if (node2.f_cost_._4_4_ == 0) {
            node2.f_cost_._4_4_ = 0;
          }
        }
      }
    }
    nodes::~nodes((nodes *)&gtest_ar_1.message_);
  }
  nodes::~nodes((nodes *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(nodesTest, methodTesting) {
  nodes node1;

  ASSERT_EQ(node1.x_, 0);

  nodes node2(1, 1, 0, 0);
  ASSERT_EQ(node2.f_cost_, 0);

  int i = 0;
  ASSERT_EQ(node2.compute_g(i), 1);

  ASSERT_DOUBLE_EQ(node2.compute_h(1, 1), 0.0);

  ASSERT_DOUBLE_EQ(node2.compute_f(1, 1), 1.0);
}